

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall Parser::Load(Parser *this,string *filename,string *err,Lexer *parent)

{
  Metrics *this_00;
  Lexer *this_01;
  int iVar1;
  Metric *pMVar2;
  Metric *local_168;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string read_err;
  string contents;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_51;
  string local_50;
  Lexer *local_30;
  Lexer *parent_local;
  string *err_local;
  string *filename_local;
  Parser *this_local;
  
  local_30 = parent;
  parent_local = (Lexer *)err;
  err_local = filename;
  filename_local = (string *)this;
  if ((Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::metrics_h_metric == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar1 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_168 = (Metric *)0x0;
      Load::metrics_h_metric = local_168;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,".ninja parse",&local_51);
      pMVar2 = Metrics::NewMetric(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      Load::metrics_h_metric = pMVar2;
    }
    __cxa_guard_release(&Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)((long)&contents.field_2 + 8),Load::metrics_h_metric);
  std::__cxx11::string::string((string *)(read_err.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_b8);
  iVar1 = (*this->file_reader_->_vptr_FileReader[2])
                    (this->file_reader_,err_local,(string *)(read_err.field_2._M_local_buf + 8),
                     (string *)local_b8);
  if (iVar1 == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)((long)&read_err.field_2 + 8));
    iVar1 = (**this->_vptr_Parser)
                      (this,err_local,(undefined1 *)((long)&read_err.field_2 + 8),parent_local);
    this_local._7_1_ = (byte)iVar1 & 1;
  }
  else {
    std::operator+(&local_118,"loading \'",err_local);
    std::operator+(&local_f8,&local_118,"\': ");
    std::operator+(&local_d8,&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::__cxx11::string::operator=((string *)parent_local,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    this_01 = local_30;
    if (local_30 != (Lexer *)0x0) {
      std::__cxx11::string::string((string *)&local_138,(string *)parent_local);
      Lexer::Error(this_01,&local_138,(string *)parent_local);
      std::__cxx11::string::~string((string *)&local_138);
    }
    this_local._7_1_ = 0;
  }
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(read_err.field_2._M_local_buf + 8));
  ScopedMetric::~ScopedMetric((ScopedMetric *)((long)&contents.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::Load(const string& filename, string* err, Lexer* parent) {
  METRIC_RECORD(".ninja parse");
  string contents;
  string read_err;
  if (file_reader_->ReadFile(filename, &contents, &read_err) !=
      FileReader::Okay) {
    *err = "loading '" + filename + "': " + read_err;
    if (parent)
      parent->Error(string(*err), err);
    return false;
  }

  // The lexer needs a nul byte at the end of its input, to know when it's done.
  // It takes a StringPiece, and StringPiece's string constructor uses
  // string::data().  data()'s return value isn't guaranteed to be
  // null-terminated (although in practice - libc++, libstdc++, msvc's stl --
  // it is, and C++11 demands that too), so add an explicit nul byte.
  contents.resize(contents.size() + 1);

  return Parse(filename, contents, err);
}